

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lrzip.c
# Opt level: O1

int archive_write_lrzip_options(archive_write_filter *f,char *key,char *value)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = f->data;
  iVar2 = strcmp(key,"compression");
  if (iVar2 == 0) {
    if (value == (char *)0x0) {
      return -0x14;
    }
    iVar2 = strcmp(value,"bzip2");
    if (iVar2 == 0) {
      *(undefined4 *)((long)pvVar1 + 0xc) = 1;
    }
    else {
      iVar2 = strcmp(value,"gzip");
      if (iVar2 == 0) {
        *(undefined4 *)((long)pvVar1 + 0xc) = 2;
      }
      else {
        iVar2 = strcmp(value,"lzo");
        if (iVar2 == 0) {
          *(undefined4 *)((long)pvVar1 + 0xc) = 3;
        }
        else {
          iVar2 = strcmp(value,"none");
          if (iVar2 == 0) {
            *(undefined4 *)((long)pvVar1 + 0xc) = 4;
          }
          else {
            iVar2 = strcmp(value,"zpaq");
            if (iVar2 != 0) {
              return -0x14;
            }
            *(undefined4 *)((long)pvVar1 + 0xc) = 5;
          }
        }
      }
    }
  }
  else {
    iVar2 = strcmp(key,"compression-level");
    if (value == (char *)0x0) {
      return -0x14;
    }
    if (iVar2 != 0) {
      return -0x14;
    }
    if (8 < (byte)(*value - 0x31U)) {
      return -0x14;
    }
    if (value[1] != '\0') {
      return -0x14;
    }
    *(uint *)((long)pvVar1 + 8) = (uint)(byte)(*value - 0x30);
  }
  return 0;
}

Assistant:

static int
archive_write_lrzip_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct write_lrzip *data = (struct write_lrzip *)f->data;

	if (strcmp(key, "compression") == 0) {
		if (value == NULL)
			return (ARCHIVE_WARN);
		else if (strcmp(value, "bzip2") == 0)
			data->compression = bzip2;
		else if (strcmp(value, "gzip") == 0)
			data->compression = gzip;
		else if (strcmp(value, "lzo") == 0)
			data->compression = lzo;
		else if (strcmp(value, "none") == 0)
			data->compression = none;
		else if (strcmp(value, "zpaq") == 0)
			data->compression = zpaq;
		else
			return (ARCHIVE_WARN);
		return (ARCHIVE_OK);
	} else if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '1' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}